

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

bool __thiscall
fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned__int128,char>
          (detail *this,appender *out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,locale_ref loc)

{
  appender aVar1;
  locale_ref in_R9;
  digit_grouping<char> grouping;
  
  digit_grouping<char>::digit_grouping(&grouping,in_R9,true);
  aVar1 = write_int_localized<fmt::v9::appender,unsigned__int128,char>
                    (*(detail **)this,(appender)out,grouping.sep_.grouping._0_16_,prefix,
                     (basic_format_specs<char> *)((ulong)specs & 0xffffffff),
                     (digit_grouping<char> *)loc.locale_);
  *(back_insert_iterator<fmt::v9::detail::buffer<char>_> *)this =
       aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  std::__cxx11::string::~string((string *)&grouping);
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}